

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O1

CrispyValue std_str(CrispyValue *value,Vm *vm)

{
  ObjDict *dict;
  size_t sVar1;
  char *pcVar2;
  CrispyValue CVar3;
  char s [23];
  char acStack_38 [32];
  
  pcVar2 = acStack_38;
  switch(value->type) {
  case NIL:
    pcVar2 = "nil";
    sVar1 = 3;
    break;
  case NUMBER:
    snprintf(acStack_38,0x17,"%.15g",(value->field_1).d_value);
    sVar1 = strlen(acStack_38);
    break;
  case OBJECT:
    dict = (ObjDict *)(value->field_1).o_value;
    switch((dict->object).type) {
    case OBJ_STRING:
      goto switchD_00108405_caseD_0;
    case OBJ_LAMBDA:
      pcVar2 = "<function>";
      sVar1 = 10;
      break;
    case OBJ_NATIVE_FUNC:
      pcVar2 = "<native function>";
      sVar1 = 0x11;
      break;
    case OBJ_DICT:
      pcVar2 = dict_to_string(dict);
      sVar1 = strlen(pcVar2);
      dict = (ObjDict *)new_string(vm,pcVar2,sVar1);
      free(pcVar2);
      goto switchD_00108405_caseD_0;
    case OBJ_LIST:
      pcVar2 = "<list>";
      sVar1 = 6;
      break;
    default:
      goto switchD_001083d6_default;
    }
    break;
  case BOOLEAN:
    if ((value->field_1).p_value == 0) {
      pcVar2 = "false";
      sVar1 = 5;
    }
    else {
      pcVar2 = "true";
      sVar1 = 4;
    }
    break;
  default:
switchD_001083d6_default:
    dict = (ObjDict *)0x0;
    goto switchD_00108405_caseD_0;
  }
  dict = (ObjDict *)new_string(vm,pcVar2,sVar1);
switchD_00108405_caseD_0:
  CVar3 = create_object(&dict->object);
  return CVar3;
}

Assistant:

CrispyValue std_str(CrispyValue *value, Vm *vm) {
    ObjString *string = NULL;

    switch (value->type) {
        case NUMBER: {
            char s[23];
            snprintf(s, 23, "%.15g", value->d_value);
            // crispy strings are not null terminated
            string = new_string(vm, s, strlen(s));
            break;
        }
        case OBJECT: {
            Object *object = value->o_value;

            switch (object->type) {
                case OBJ_STRING:
                    string = (ObjString *) object;
                    break;
                case OBJ_LAMBDA:
                    // TODO arity
                    string = new_string(vm, "<function>", 10);
                    break;
                case OBJ_NATIVE_FUNC:
                    // TODO arity
                    string = new_string(vm, "<native function>", 17);
                    break;
                case OBJ_DICT: {
                    char *dict_string = dict_to_string((ObjDict *) object);
                    string = new_string(vm, dict_string, strlen(dict_string));
                    free(dict_string);
                    break;
                }
                case OBJ_LIST:
                    string = new_string(vm, "<list>", 6);
                    break;
            }
            break;
        }
        case BOOLEAN: {
            string = value->p_value ? new_string(vm, "true", 4) : new_string(vm, "false", 5);
            break;
        }
        case NIL:
            string = new_string(vm, "nil", 3);
            break;
    }

    return create_object((Object *) string);
}